

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall
soul::AST::ProcessorBase::ProcessorBase
          (ProcessorBase *this,ObjectType ot,CodeLocation *processorKeyword,Context *processorName,
          Identifier moduleName)

{
  CodeLocation local_30;
  
  local_30.sourceCode.object = (processorKeyword->sourceCode).object;
  if (local_30.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_30.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_30.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_30.location.data = (processorKeyword->location).data;
  ModuleBase::ModuleBase(&this->super_ModuleBase,ot,&local_30,processorName,moduleName);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_30.sourceCode);
  (this->super_ModuleBase).super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__ProcessorBase_002f7c30;
  (this->super_ModuleBase).super_Scope._vptr_Scope = (_func_int **)&PTR__ProcessorBase_002f7ce8;
  (this->endpoints).
  super__Vector_base<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->endpoints).
  super__Vector_base<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->endpoints).
  super__Vector_base<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->annotation).properties.
  super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->annotation).properties.
  super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->annotation).properties.
  super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->owningInstance).object = (ProcessorInstance *)0x0;
  (this->originalBeforeSpecialisation).object = (ProcessorBase *)0x0;
  if ((this->super_ModuleBase).super_ASTObject.context.parentScope != (Scope *)0x0) {
    return;
  }
  throwInternalCompilerError("getParentScope() != nullptr","ProcessorBase",0x2cd);
}

Assistant:

ProcessorBase (ObjectType ot, CodeLocation processorKeyword, const Context& processorName, Identifier moduleName)
            : ModuleBase (ot, processorKeyword, processorName, moduleName)
        {
            SOUL_ASSERT (getParentScope() != nullptr);
        }